

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

void __thiscall
despot::util::tinyxml::TiXmlAttributeSet::Add(TiXmlAttributeSet *this,TiXmlAttribute *addMe)

{
  TiXmlAttribute *pTVar1;
  
  pTVar1 = Find(this,((addMe->name).rep_)->str);
  if (pTVar1 == (TiXmlAttribute *)0x0) {
    addMe->next = &this->sentinel;
    pTVar1 = (this->sentinel).prev;
    addMe->prev = pTVar1;
    pTVar1->next = addMe;
    (this->sentinel).prev = addMe;
    return;
  }
  __assert_fail("!Find(addMe->Name())",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxml.cpp"
                ,0x516,"void despot::util::tinyxml::TiXmlAttributeSet::Add(TiXmlAttribute *)");
}

Assistant:

void TiXmlAttributeSet::Add(TiXmlAttribute* addMe) {
#ifdef TIXML_USE_STL
	assert( !Find( TIXML_STRING( addMe->Name() ) ) ); // Shouldn't be multiply adding to the set.
#else
	assert(!Find(addMe->Name())); // Shouldn't be multiply adding to the set.
#endif

	addMe->next = &sentinel;
	addMe->prev = sentinel.prev;

	sentinel.prev->next = addMe;
	sentinel.prev = addMe;
}